

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::InitializeFiles(metadata_map_t *m)

{
  bool bVar1;
  int iVar2;
  FILE *f;
  MetadataInfo *info;
  reference local_30;
  value_type *v;
  iter_t j;
  iter_t i;
  metadata_map_t *m_local;
  
  j._M_node = (_Base_ptr)
              std::
              map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
              ::begin(m);
  v = (value_type *)
      std::
      map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
      ::end(m);
  do {
    bVar1 = std::operator!=(&j,(_Self *)&v);
    if (!bVar1) {
      return true;
    }
    info = (MetadataInfo *)
           std::_Rb_tree_const_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>::
           operator++(&j,0);
    local_30 = std::_Rb_tree_const_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>
                            *)&info);
    iVar2 = fputs("WEBVTT\n",(FILE *)(local_30->second).file);
  } while (-1 < iVar2);
  printf("unable to initialize output file\n");
  return false;
}

Assistant:

bool vttdemux::InitializeFiles(const metadata_map_t& m) {
  // Write the WebVTT header for each output file in the cache.

  typedef metadata_map_t::const_iterator iter_t;
  iter_t i = m.begin();
  const iter_t j = m.end();

  while (i != j) {
    const metadata_map_t::value_type& v = *i++;
    const MetadataInfo& info = v.second;
    FILE* const f = info.file;

    if (fputs("WEBVTT\n", f) < 0) {
      printf("unable to initialize output file\n");
      return false;
    }
  }

  return true;
}